

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  ulong uVar7;
  undefined8 uVar8;
  Scene *pSVar9;
  float **ppfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  Geometry *pGVar15;
  RTCRayQueryContext *pRVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 (*pauVar22) [16];
  int iVar23;
  undefined4 uVar24;
  undefined1 (*pauVar25) [16];
  long lVar26;
  int *piVar28;
  ulong uVar29;
  ulong uVar30;
  Scene *scene;
  ulong uVar31;
  ulong uVar32;
  int *piVar33;
  ulong uVar34;
  ulong uVar35;
  RayQueryContext *pRVar36;
  undefined1 (*pauVar37) [16];
  ulong unaff_R12;
  size_t mask;
  ulong uVar38;
  long lVar39;
  float fVar40;
  uint uVar41;
  float fVar42;
  float fVar51;
  float fVar54;
  vint4 bi;
  uint uVar52;
  uint uVar55;
  float fVar56;
  uint uVar57;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar53;
  undefined1 auVar50 [16];
  float fVar58;
  float fVar62;
  float fVar63;
  vint4 bi_1;
  float fVar64;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar65;
  uint uVar66;
  float fVar67;
  float fVar69;
  uint uVar70;
  float fVar71;
  float fVar72;
  uint uVar73;
  float fVar74;
  vint4 ai;
  undefined1 auVar68 [16];
  float fVar75;
  uint uVar76;
  float fVar77;
  float fVar78;
  float fVar81;
  float fVar82;
  vint4 ai_1;
  undefined1 auVar79 [16];
  float fVar83;
  undefined1 auVar80 [16];
  float fVar84;
  float fVar89;
  float fVar90;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar91;
  undefined1 auVar88 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar94;
  float fVar97;
  float fVar98;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_119c;
  undefined8 local_1198;
  float fStack_1190;
  float fStack_118c;
  undefined1 local_1188 [16];
  RTCIntersectArguments *local_1170;
  RTCFilterFunctionNArguments local_1168;
  undefined1 local_1138 [16];
  Geometry *local_1128;
  int *local_1120;
  ulong local_1118;
  ulong local_1110;
  float local_1108;
  float local_1104;
  float local_1100;
  float local_10fc;
  float local_10f8;
  undefined4 local_10f4;
  uint local_10f0;
  uint local_10ec;
  uint local_10e8;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined1 local_10c8 [16];
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1078 [16];
  float local_1068 [4];
  float local_1058 [4];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  float local_1028 [4];
  float local_1018 [4];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  ulong uVar27;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      pauVar37 = (undefined1 (*) [16])local_f68;
      fVar67 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_fa8 = 0.0;
      if (0.0 <= fVar67) {
        local_fa8 = fVar67;
      }
      local_fd8 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_fe8 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_fb8 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar67 = (ray->super_RayK<1>).tfar;
      fVar58 = 0.0;
      if (0.0 <= fVar67) {
        fVar58 = fVar67;
      }
      aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
      auVar68._4_4_ = -(uint)(ABS(aVar6.y) < DAT_01ff1d40._4_4_);
      auVar68._0_4_ = -(uint)(ABS(aVar6.x) < (float)DAT_01ff1d40);
      auVar68._8_4_ = -(uint)(ABS(aVar6.z) < DAT_01ff1d40._8_4_);
      auVar68._12_4_ = -(uint)(ABS(aVar6.field_3.w) < DAT_01ff1d40._12_4_);
      auVar68 = blendvps((undefined1  [16])aVar6,_DAT_01ff1d40,auVar68);
      auVar79 = rcpps(_DAT_01ff1d40,auVar68);
      local_ff8 = auVar79._0_4_;
      local_1008 = auVar79._4_4_;
      local_fc8 = auVar79._8_4_;
      local_ff8 = (1.0 - auVar68._0_4_ * local_ff8) * local_ff8 + local_ff8;
      local_1008 = (1.0 - auVar68._4_4_ * local_1008) * local_1008 + local_1008;
      local_fc8 = (1.0 - auVar68._8_4_ * local_fc8) * local_fc8 + local_fc8;
      uVar34 = (ulong)(local_ff8 < 0.0) * 0x10;
      uVar38 = (ulong)(local_1008 < 0.0) << 4 | 0x20;
      uVar31 = (ulong)(local_fc8 < 0.0) << 4 | 0x40;
      _local_f98 = mm_lookupmask_ps._240_8_;
      _uStack_f90 = mm_lookupmask_ps._248_8_;
      fStack_fa4 = local_fa8;
      fStack_fa0 = local_fa8;
      fStack_f9c = local_fa8;
      fStack_fb4 = local_fb8;
      fStack_fb0 = local_fb8;
      fStack_fac = local_fb8;
      fStack_fc4 = local_fc8;
      fStack_fc0 = local_fc8;
      fStack_fbc = local_fc8;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      fStack_ff4 = local_ff8;
      fStack_ff0 = local_ff8;
      fStack_fec = local_ff8;
      fStack_1004 = local_1008;
      fStack_1000 = local_1008;
      fStack_ffc = local_1008;
      local_1110 = uVar38;
      local_1118 = uVar31;
      uVar32 = uVar31;
      local_1198 = context;
      uVar27 = uVar38;
      fVar67 = local_fa8;
      fVar42 = local_fa8;
      fVar71 = local_fa8;
      fVar62 = local_fa8;
      fVar53 = local_fb8;
      fVar74 = local_fb8;
      fVar63 = local_fb8;
      fVar77 = local_fb8;
      fVar64 = local_fc8;
      fVar106 = local_fc8;
      fVar108 = local_fc8;
      fVar104 = local_fc8;
      fVar105 = local_fd8;
      fVar107 = local_fd8;
      fVar109 = local_fd8;
      fVar78 = local_fd8;
      fVar81 = local_fe8;
      fVar82 = local_fe8;
      fVar83 = local_fe8;
      fVar84 = local_fe8;
      fVar89 = local_ff8;
      fVar90 = local_ff8;
      fVar91 = local_ff8;
      fVar94 = local_ff8;
      fVar97 = local_1008;
      fVar98 = local_1008;
      fVar99 = local_1008;
      fVar100 = local_1008;
      fVar101 = fVar58;
      fVar102 = fVar58;
      fVar103 = fVar58;
      do {
        do {
          do {
            pauVar25 = (undefined1 (*) [16])&local_f78;
            if (pauVar37 == pauVar25) {
              return;
            }
            pauVar22 = pauVar37 + -1;
            pauVar37 = pauVar37 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar22 + 8));
          uVar30 = *(ulong *)*pauVar37;
          do {
            if ((uVar30 & 8) == 0) {
              pfVar4 = (float *)(uVar30 + 0x20 + uVar34);
              fVar40 = (*pfVar4 - fVar105) * fVar89;
              fVar51 = (pfVar4[1] - fVar107) * fVar90;
              fVar54 = (pfVar4[2] - fVar109) * fVar91;
              fVar56 = (pfVar4[3] - fVar78) * fVar94;
              pfVar4 = (float *)(uVar30 + 0x20 + uVar27);
              fVar65 = (*pfVar4 - fVar81) * fVar97;
              fVar69 = (pfVar4[1] - fVar82) * fVar98;
              fVar72 = (pfVar4[2] - fVar83) * fVar99;
              fVar75 = (pfVar4[3] - fVar84) * fVar100;
              uVar66 = (uint)((int)fVar65 < (int)fVar40) * (int)fVar40 |
                       (uint)((int)fVar65 >= (int)fVar40) * (int)fVar65;
              uVar70 = (uint)((int)fVar69 < (int)fVar51) * (int)fVar51 |
                       (uint)((int)fVar69 >= (int)fVar51) * (int)fVar69;
              uVar73 = (uint)((int)fVar72 < (int)fVar54) * (int)fVar54 |
                       (uint)((int)fVar72 >= (int)fVar54) * (int)fVar72;
              uVar76 = (uint)((int)fVar75 < (int)fVar56) * (int)fVar56 |
                       (uint)((int)fVar75 >= (int)fVar56) * (int)fVar75;
              pfVar4 = (float *)(uVar30 + 0x20 + uVar32);
              fVar40 = (*pfVar4 - fVar53) * fVar64;
              fVar51 = (pfVar4[1] - fVar74) * fVar106;
              fVar54 = (pfVar4[2] - fVar63) * fVar108;
              fVar56 = (pfVar4[3] - fVar77) * fVar104;
              uVar41 = (uint)((int)fVar40 < (int)fVar67) * (int)fVar67 |
                       (uint)((int)fVar40 >= (int)fVar67) * (int)fVar40;
              uVar52 = (uint)((int)fVar51 < (int)fVar42) * (int)fVar42 |
                       (uint)((int)fVar51 >= (int)fVar42) * (int)fVar51;
              uVar55 = (uint)((int)fVar54 < (int)fVar71) * (int)fVar71 |
                       (uint)((int)fVar54 >= (int)fVar71) * (int)fVar54;
              uVar57 = (uint)((int)fVar56 < (int)fVar62) * (int)fVar62 |
                       (uint)((int)fVar56 >= (int)fVar62) * (int)fVar56;
              local_10c8._0_4_ =
                   ((int)uVar41 < (int)uVar66) * uVar66 | ((int)uVar41 >= (int)uVar66) * uVar41;
              local_10c8._4_4_ =
                   ((int)uVar52 < (int)uVar70) * uVar70 | ((int)uVar52 >= (int)uVar70) * uVar52;
              local_10c8._8_4_ =
                   ((int)uVar55 < (int)uVar73) * uVar73 | ((int)uVar55 >= (int)uVar73) * uVar55;
              local_10c8._12_4_ =
                   ((int)uVar57 < (int)uVar76) * uVar76 | ((int)uVar57 >= (int)uVar76) * uVar57;
              pfVar4 = (float *)(uVar30 + 0x20 + (uVar34 ^ 0x10));
              fVar40 = (*pfVar4 - fVar105) * fVar89;
              fVar51 = (pfVar4[1] - fVar107) * fVar90;
              fVar54 = (pfVar4[2] - fVar109) * fVar91;
              fVar56 = (pfVar4[3] - fVar78) * fVar94;
              pfVar4 = (float *)(uVar30 + 0x20 + (uVar38 ^ 0x10));
              fVar65 = (*pfVar4 - fVar81) * fVar97;
              fVar69 = (pfVar4[1] - fVar82) * fVar98;
              fVar72 = (pfVar4[2] - fVar83) * fVar99;
              fVar75 = (pfVar4[3] - fVar84) * fVar100;
              uVar66 = (uint)((int)fVar40 < (int)fVar65) * (int)fVar40 |
                       (uint)((int)fVar40 >= (int)fVar65) * (int)fVar65;
              uVar70 = (uint)((int)fVar51 < (int)fVar69) * (int)fVar51 |
                       (uint)((int)fVar51 >= (int)fVar69) * (int)fVar69;
              uVar73 = (uint)((int)fVar54 < (int)fVar72) * (int)fVar54 |
                       (uint)((int)fVar54 >= (int)fVar72) * (int)fVar72;
              uVar76 = (uint)((int)fVar56 < (int)fVar75) * (int)fVar56 |
                       (uint)((int)fVar56 >= (int)fVar75) * (int)fVar75;
              pfVar4 = (float *)(uVar30 + 0x20 + (uVar31 ^ 0x10));
              fVar40 = (*pfVar4 - fVar53) * fVar64;
              fVar51 = (pfVar4[1] - fVar74) * fVar106;
              fVar54 = (pfVar4[2] - fVar63) * fVar108;
              fVar56 = (pfVar4[3] - fVar77) * fVar104;
              uVar41 = (uint)((int)fVar58 < (int)fVar40) * (int)fVar58 |
                       (uint)((int)fVar58 >= (int)fVar40) * (int)fVar40;
              uVar52 = (uint)((int)fVar101 < (int)fVar51) * (int)fVar101 |
                       (uint)((int)fVar101 >= (int)fVar51) * (int)fVar51;
              uVar55 = (uint)((int)fVar102 < (int)fVar54) * (int)fVar102 |
                       (uint)((int)fVar102 >= (int)fVar54) * (int)fVar54;
              uVar57 = (uint)((int)fVar103 < (int)fVar56) * (int)fVar103 |
                       (uint)((int)fVar103 >= (int)fVar56) * (int)fVar56;
              auVar79._0_4_ =
                   -(uint)((int)(((int)uVar66 < (int)uVar41) * uVar66 |
                                ((int)uVar66 >= (int)uVar41) * uVar41) < (int)local_10c8._0_4_);
              auVar79._4_4_ =
                   -(uint)((int)(((int)uVar70 < (int)uVar52) * uVar70 |
                                ((int)uVar70 >= (int)uVar52) * uVar52) < (int)local_10c8._4_4_);
              auVar79._8_4_ =
                   -(uint)((int)(((int)uVar73 < (int)uVar55) * uVar73 |
                                ((int)uVar73 >= (int)uVar55) * uVar55) < (int)local_10c8._8_4_);
              auVar79._12_4_ =
                   -(uint)((int)(((int)uVar76 < (int)uVar57) * uVar76 |
                                ((int)uVar76 >= (int)uVar57) * uVar57) < (int)local_10c8._12_4_);
              uVar41 = movmskps((int)pauVar25,auVar79);
              unaff_R12 = ((ulong)uVar41 ^ 0xf) & 0xff;
            }
            if ((uVar30 & 8) == 0) {
              if (unaff_R12 == 0) {
                pauVar25 = (undefined1 (*) [16])0x4;
              }
              else {
                uVar29 = uVar30 & 0xfffffffffffffff0;
                lVar39 = 0;
                if (unaff_R12 != 0) {
                  for (; (unaff_R12 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                  }
                }
                pauVar25 = (undefined1 (*) [16])0x0;
                uVar30 = *(ulong *)(uVar29 + lVar39 * 8);
                uVar35 = unaff_R12 - 1 & unaff_R12;
                if (uVar35 != 0) {
                  uVar41 = *(uint *)(local_10c8 + lVar39 * 4);
                  lVar39 = 0;
                  if (uVar35 != 0) {
                    for (; (uVar35 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                    }
                  }
                  uVar7 = *(ulong *)(uVar29 + lVar39 * 8);
                  uVar52 = *(uint *)(local_10c8 + lVar39 * 4);
                  uVar35 = uVar35 - 1 & uVar35;
                  if (uVar35 == 0) {
                    if (uVar41 < uVar52) {
                      *(ulong *)*pauVar37 = uVar7;
                      *(uint *)((long)*pauVar37 + 8) = uVar52;
                      pauVar37 = pauVar37 + 1;
                    }
                    else {
                      *(ulong *)*pauVar37 = uVar30;
                      *(uint *)((long)*pauVar37 + 8) = uVar41;
                      uVar30 = uVar7;
                      pauVar37 = pauVar37 + 1;
                    }
                  }
                  else {
                    auVar86._8_4_ = uVar41;
                    auVar86._0_8_ = uVar30;
                    auVar86._12_4_ = 0;
                    auVar93._8_4_ = uVar52;
                    auVar93._0_8_ = uVar7;
                    auVar93._12_4_ = 0;
                    lVar39 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                      }
                    }
                    uVar8 = *(undefined8 *)(uVar29 + lVar39 * 8);
                    iVar23 = *(int *)(local_10c8 + lVar39 * 4);
                    auVar96._8_4_ = iVar23;
                    auVar96._0_8_ = uVar8;
                    auVar96._12_4_ = 0;
                    auVar87._8_4_ = -(uint)((int)uVar41 < (int)uVar52);
                    uVar35 = uVar35 - 1 & uVar35;
                    if (uVar35 == 0) {
                      auVar87._4_4_ = auVar87._8_4_;
                      auVar87._0_4_ = auVar87._8_4_;
                      auVar87._12_4_ = auVar87._8_4_;
                      auVar85._8_4_ = uVar52;
                      auVar85._0_8_ = uVar7;
                      auVar85._12_4_ = 0;
                      auVar79 = blendvps(auVar85,auVar86,auVar87);
                      auVar68 = blendvps(auVar86,auVar93,auVar87);
                      auVar43._8_4_ = -(uint)(auVar79._8_4_ < iVar23);
                      auVar43._4_4_ = auVar43._8_4_;
                      auVar43._0_4_ = auVar43._8_4_;
                      auVar43._12_4_ = auVar43._8_4_;
                      auVar92._8_4_ = iVar23;
                      auVar92._0_8_ = uVar8;
                      auVar92._12_4_ = 0;
                      auVar93 = blendvps(auVar92,auVar79,auVar43);
                      auVar86 = blendvps(auVar79,auVar96,auVar43);
                      auVar44._8_4_ = -(uint)(auVar68._8_4_ < auVar86._8_4_);
                      auVar44._4_4_ = auVar44._8_4_;
                      auVar44._0_4_ = auVar44._8_4_;
                      auVar44._12_4_ = auVar44._8_4_;
                      auVar79 = blendvps(auVar86,auVar68,auVar44);
                      auVar68 = blendvps(auVar68,auVar86,auVar44);
                      *pauVar37 = auVar68;
                      pauVar37[1] = auVar79;
                      uVar30 = auVar93._0_8_;
                      pauVar37 = pauVar37 + 2;
                    }
                    else {
                      lVar39 = 0;
                      if (uVar35 != 0) {
                        for (; (uVar35 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                        }
                      }
                      auVar45._4_4_ = auVar87._8_4_;
                      auVar45._0_4_ = auVar87._8_4_;
                      auVar45._8_4_ = auVar87._8_4_;
                      auVar45._12_4_ = auVar87._8_4_;
                      auVar87 = blendvps(auVar93,auVar86,auVar45);
                      auVar68 = blendvps(auVar86,auVar93,auVar45);
                      auVar95._8_4_ = *(int *)(local_10c8 + lVar39 * 4);
                      auVar95._0_8_ = *(undefined8 *)(uVar29 + lVar39 * 8);
                      auVar95._12_4_ = 0;
                      auVar46._8_4_ = -(uint)(iVar23 < *(int *)(local_10c8 + lVar39 * 4));
                      auVar46._4_4_ = auVar46._8_4_;
                      auVar46._0_4_ = auVar46._8_4_;
                      auVar46._12_4_ = auVar46._8_4_;
                      auVar86 = blendvps(auVar95,auVar96,auVar46);
                      auVar79 = blendvps(auVar96,auVar95,auVar46);
                      auVar47._8_4_ = -(uint)(auVar68._8_4_ < auVar79._8_4_);
                      auVar47._4_4_ = auVar47._8_4_;
                      auVar47._0_4_ = auVar47._8_4_;
                      auVar47._12_4_ = auVar47._8_4_;
                      auVar96 = blendvps(auVar79,auVar68,auVar47);
                      auVar68 = blendvps(auVar68,auVar79,auVar47);
                      auVar48._8_4_ = -(uint)(auVar87._8_4_ < auVar86._8_4_);
                      auVar48._4_4_ = auVar48._8_4_;
                      auVar48._0_4_ = auVar48._8_4_;
                      auVar48._12_4_ = auVar48._8_4_;
                      auVar79 = blendvps(auVar86,auVar87,auVar48);
                      auVar86 = blendvps(auVar87,auVar86,auVar48);
                      auVar49._8_4_ = -(uint)(auVar86._8_4_ < auVar96._8_4_);
                      auVar49._4_4_ = auVar49._8_4_;
                      auVar49._0_4_ = auVar49._8_4_;
                      auVar49._12_4_ = auVar49._8_4_;
                      auVar93 = blendvps(auVar96,auVar86,auVar49);
                      auVar86 = blendvps(auVar86,auVar96,auVar49);
                      *pauVar37 = auVar68;
                      pauVar37[1] = auVar86;
                      pauVar37[2] = auVar93;
                      uVar30 = auVar79._0_8_;
                      pauVar37 = pauVar37 + 3;
                    }
                  }
                }
              }
            }
            else {
              pauVar25 = (undefined1 (*) [16])0x6;
            }
          } while ((int)pauVar25 == 0);
        } while ((int)pauVar25 != 6);
        uVar32 = (ulong)((uint)uVar30 & 0xf);
        if (uVar32 != 8) {
          uVar30 = uVar30 & 0xfffffffffffffff0;
          pSVar9 = local_1198->scene;
          lVar39 = 0;
          pRVar36 = local_1198;
          do {
            lVar26 = lVar39 * 0x50;
            ppfVar10 = (pSVar9->vertices).items;
            pfVar11 = ppfVar10[*(uint *)(uVar30 + 0x30 + lVar26)];
            pfVar4 = pfVar11 + *(uint *)(uVar30 + lVar26);
            fVar67 = *pfVar4;
            fVar58 = pfVar4[1];
            fVar42 = pfVar4[2];
            pfVar4 = pfVar11 + *(uint *)(uVar30 + 0x10 + lVar26);
            pfVar11 = pfVar11 + *(uint *)(uVar30 + 0x20 + lVar26);
            pfVar12 = ppfVar10[*(uint *)(uVar30 + 0x34 + lVar26)];
            pfVar1 = pfVar12 + *(uint *)(uVar30 + 4 + lVar26);
            fVar71 = *pfVar1;
            fVar62 = pfVar1[1];
            fVar53 = pfVar1[2];
            pfVar1 = pfVar12 + *(uint *)(uVar30 + 0x14 + lVar26);
            pfVar12 = pfVar12 + *(uint *)(uVar30 + 0x24 + lVar26);
            pfVar13 = ppfVar10[*(uint *)(uVar30 + 0x38 + lVar26)];
            pfVar2 = pfVar13 + *(uint *)(uVar30 + 8 + lVar26);
            fVar74 = *pfVar2;
            fVar63 = pfVar2[1];
            fStack_1190 = pfVar2[2];
            pfVar2 = pfVar13 + *(uint *)(uVar30 + 0x18 + lVar26);
            pfVar13 = pfVar13 + *(uint *)(uVar30 + 0x28 + lVar26);
            pfVar14 = ppfVar10[*(uint *)(uVar30 + 0x3c + lVar26)];
            pfVar3 = pfVar14 + *(uint *)(uVar30 + 0xc + lVar26);
            fVar77 = *pfVar3;
            fVar64 = pfVar3[1];
            fStack_118c = pfVar3[2];
            pfVar3 = pfVar14 + *(uint *)(uVar30 + 0x1c + lVar26);
            pfVar14 = pfVar14 + *(uint *)(uVar30 + 0x2c + lVar26);
            puVar5 = (undefined8 *)(uVar30 + 0x30 + lVar26);
            local_f88 = *puVar5;
            uStack_f80 = puVar5[1];
            puVar5 = (undefined8 *)(uVar30 + 0x40 + lVar26);
            local_10d8 = *puVar5;
            uStack_10d0 = puVar5[1];
            fVar100 = fVar67 - *pfVar4;
            fVar101 = fVar71 - *pfVar1;
            fVar102 = fVar74 - *pfVar2;
            fVar103 = fVar77 - *pfVar3;
            fVar54 = fVar58 - pfVar4[1];
            fVar56 = fVar62 - pfVar1[1];
            fVar65 = fVar63 - pfVar2[1];
            fVar69 = fVar64 - pfVar3[1];
            fVar72 = fVar42 - pfVar4[2];
            fVar75 = fVar53 - pfVar1[2];
            fVar110 = fStack_1190 - pfVar2[2];
            fVar112 = fStack_118c - pfVar3[2];
            fVar78 = *pfVar11 - fVar67;
            fVar81 = *pfVar12 - fVar71;
            fVar82 = *pfVar13 - fVar74;
            fVar83 = *pfVar14 - fVar77;
            fVar94 = pfVar11[1] - fVar58;
            fVar97 = pfVar12[1] - fVar62;
            fVar98 = pfVar13[1] - fVar63;
            fVar99 = pfVar14[1] - fVar64;
            fVar84 = pfVar11[2] - fVar42;
            fVar89 = pfVar12[2] - fVar53;
            fVar90 = pfVar13[2] - fStack_1190;
            fVar91 = pfVar14[2] - fStack_118c;
            local_1038._0_4_ = fVar72 * fVar94 - fVar54 * fVar84;
            local_1038._4_4_ = fVar75 * fVar97 - fVar56 * fVar89;
            local_1038._8_4_ = fVar110 * fVar98 - fVar65 * fVar90;
            local_1038._12_4_ = fVar112 * fVar99 - fVar69 * fVar91;
            fVar106 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar108 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar104 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar105 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar107 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar109 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar67 = fVar67 - fVar106;
            fVar71 = fVar71 - fVar106;
            fVar74 = fVar74 - fVar106;
            fVar77 = fVar77 - fVar106;
            fVar58 = fVar58 - fVar108;
            fVar62 = fVar62 - fVar108;
            fVar63 = fVar63 - fVar108;
            fVar64 = fVar64 - fVar108;
            fVar118 = fVar67 * fVar107 - fVar58 * fVar105;
            fVar119 = fVar71 * fVar107 - fVar62 * fVar105;
            fVar120 = fVar74 * fVar107 - fVar63 * fVar105;
            fVar121 = fVar77 * fVar107 - fVar64 * fVar105;
            local_1028[0] = fVar100 * fVar84 - fVar72 * fVar78;
            local_1028[1] = fVar101 * fVar89 - fVar75 * fVar81;
            local_1028[2] = fVar102 * fVar90 - fVar110 * fVar82;
            local_1028[3] = fVar103 * fVar91 - fVar112 * fVar83;
            fVar42 = fVar42 - fVar104;
            fVar53 = fVar53 - fVar104;
            fStack_1190 = fStack_1190 - fVar104;
            fStack_118c = fStack_118c - fVar104;
            fVar114 = fVar42 * fVar105 - fVar67 * fVar109;
            fVar115 = fVar53 * fVar105 - fVar71 * fVar109;
            fVar116 = fStack_1190 * fVar105 - fVar74 * fVar109;
            fVar117 = fStack_118c * fVar105 - fVar77 * fVar109;
            local_1018[0] = fVar54 * fVar78 - fVar100 * fVar94;
            local_1018[1] = fVar56 * fVar81 - fVar101 * fVar97;
            local_1018[2] = fVar65 * fVar82 - fVar102 * fVar98;
            local_1018[3] = fVar69 * fVar83 - fVar103 * fVar99;
            local_1198 = (RayQueryContext *)CONCAT44(fVar53,fVar42);
            fVar106 = fVar58 * fVar109 - fVar42 * fVar107;
            fVar108 = fVar62 * fVar109 - fVar53 * fVar107;
            fVar111 = fVar63 * fVar109 - fStack_1190 * fVar107;
            fVar113 = fVar64 * fVar109 - fStack_118c * fVar107;
            fVar104 = fVar105 * local_1038._0_4_ + fVar107 * local_1028[0] + fVar109 * local_1018[0]
            ;
            fVar40 = fVar105 * local_1038._4_4_ + fVar107 * local_1028[1] + fVar109 * local_1018[1];
            fVar51 = fVar105 * local_1038._8_4_ + fVar107 * local_1028[2] + fVar109 * local_1018[2];
            fVar105 = fVar105 * local_1038._12_4_ +
                      fVar107 * local_1028[3] + fVar109 * local_1018[3];
            uVar41 = (uint)fVar104 & 0x80000000;
            uVar52 = (uint)fVar40 & 0x80000000;
            uVar55 = (uint)fVar51 & 0x80000000;
            uVar57 = (uint)fVar105 & 0x80000000;
            local_10c8._0_4_ =
                 (uint)(fVar78 * fVar106 + fVar94 * fVar114 + fVar84 * fVar118) ^ uVar41;
            local_10c8._4_4_ =
                 (uint)(fVar81 * fVar108 + fVar97 * fVar115 + fVar89 * fVar119) ^ uVar52;
            local_10c8._8_4_ =
                 (uint)(fVar82 * fVar111 + fVar98 * fVar116 + fVar90 * fVar120) ^ uVar55;
            local_10c8._12_4_ =
                 (uint)(fVar83 * fVar113 + fVar99 * fVar117 + fVar91 * fVar121) ^ uVar57;
            local_10b8 = (float)((uint)(fVar106 * fVar100 + fVar114 * fVar54 + fVar118 * fVar72) ^
                                uVar41);
            fStack_10b4 = (float)((uint)(fVar108 * fVar101 + fVar115 * fVar56 + fVar119 * fVar75) ^
                                 uVar52);
            fStack_10b0 = (float)((uint)(fVar111 * fVar102 + fVar116 * fVar65 + fVar120 * fVar110) ^
                                 uVar55);
            fStack_10ac = (float)((uint)(fVar113 * fVar103 + fVar117 * fVar69 + fVar121 * fVar112) ^
                                 uVar57);
            fVar106 = ABS(fVar104);
            fVar108 = ABS(fVar40);
            local_1098._0_8_ = CONCAT44(fVar40,fVar104) & 0x7fffffff7fffffff;
            local_1098._8_4_ = ABS(fVar51);
            local_1098._12_4_ = ABS(fVar105);
            uVar66 = -(uint)((float)local_10c8._0_4_ + local_10b8 <= fVar106) &
                     -(uint)((0.0 <= local_10b8 && 0.0 <= (float)local_10c8._0_4_) && fVar104 != 0.0
                            ) & local_f98;
            uVar70 = -(uint)((float)local_10c8._4_4_ + fStack_10b4 <= fVar108) &
                     -(uint)((0.0 <= fStack_10b4 && 0.0 <= (float)local_10c8._4_4_) && fVar40 != 0.0
                            ) & uStack_f94;
            uVar73 = -(uint)((float)local_10c8._8_4_ + fStack_10b0 <= local_1098._8_4_) &
                     -(uint)((0.0 <= fStack_10b0 && 0.0 <= (float)local_10c8._8_4_) && fVar51 != 0.0
                            ) & uStack_f90;
            uVar76 = -(uint)((float)local_10c8._12_4_ + fStack_10ac <= local_1098._12_4_) &
                     -(uint)((0.0 <= fStack_10ac && 0.0 <= (float)local_10c8._12_4_) &&
                            fVar105 != 0.0) & uStack_f8c;
            auVar21._4_4_ = uVar70;
            auVar21._0_4_ = uVar66;
            auVar21._8_4_ = uVar73;
            auVar21._12_4_ = uVar76;
            iVar23 = movmskps((int)lVar26,auVar21);
            local_1198 = pRVar36;
            if (iVar23 != 0) {
              local_10a8._0_4_ =
                   (float)(uVar41 ^ (uint)(fVar67 * local_1038._0_4_ +
                                          fVar58 * local_1028[0] + fVar42 * local_1018[0]));
              local_10a8._4_4_ =
                   (float)(uVar52 ^ (uint)(fVar71 * local_1038._4_4_ +
                                          fVar62 * local_1028[1] + fVar53 * local_1018[1]));
              local_10a8._8_4_ =
                   (float)(uVar55 ^ (uint)(fVar74 * local_1038._8_4_ +
                                          fVar63 * local_1028[2] + fStack_1190 * local_1018[2]));
              local_10a8._12_4_ =
                   (float)(uVar57 ^ (uint)(fVar77 * local_1038._12_4_ +
                                          fVar64 * local_1028[3] + fStack_118c * local_1018[3]));
              fVar67 = (ray->super_RayK<1>).org.field_0.m128[3];
              bVar17 = fVar67 * fVar106 < local_10a8._0_4_;
              bVar18 = fVar67 * fVar108 < local_10a8._4_4_;
              bVar19 = fVar67 * local_1098._8_4_ < local_10a8._8_4_;
              bVar20 = fVar67 * local_1098._12_4_ < local_10a8._12_4_;
              auVar59._4_4_ = -(uint)bVar18;
              auVar59._0_4_ = -(uint)bVar17;
              auVar59._8_4_ = -(uint)bVar19;
              auVar59._12_4_ = -(uint)bVar20;
              fVar67 = (ray->super_RayK<1>).tfar;
              auVar50._0_4_ = -(uint)(local_10a8._0_4_ <= fVar67 * fVar106 && bVar17) & uVar66;
              auVar50._4_4_ = -(uint)(local_10a8._4_4_ <= fVar67 * fVar108 && bVar18) & uVar70;
              auVar50._8_4_ =
                   -(uint)(local_10a8._8_4_ <= fVar67 * local_1098._8_4_ && bVar19) & uVar73;
              auVar50._12_4_ =
                   -(uint)(local_10a8._12_4_ <= fVar67 * local_1098._12_4_ && bVar20) & uVar76;
              iVar23 = movmskps(iVar23,auVar50);
              if (iVar23 != 0) {
                local_1078 = auVar50;
                auVar68 = rcpps(auVar59,local_1098);
                fVar67 = auVar68._0_4_;
                fVar58 = auVar68._4_4_;
                fVar42 = auVar68._8_4_;
                fVar71 = auVar68._12_4_;
                fVar67 = (1.0 - fVar106 * fVar67) * fVar67 + fVar67;
                fVar58 = (1.0 - fVar108 * fVar58) * fVar58 + fVar58;
                fVar42 = (1.0 - local_1098._8_4_ * fVar42) * fVar42 + fVar42;
                fVar71 = (1.0 - local_1098._12_4_ * fVar71) * fVar71 + fVar71;
                auVar88._0_4_ = local_10a8._0_4_ * fVar67;
                auVar88._4_4_ = local_10a8._4_4_ * fVar58;
                auVar88._8_4_ = local_10a8._8_4_ * fVar42;
                auVar88._12_4_ = local_10a8._12_4_ * fVar71;
                local_1048 = auVar88;
                local_1068[0] = (float)local_10c8._0_4_ * fVar67;
                local_1068[1] = (float)local_10c8._4_4_ * fVar58;
                local_1068[2] = (float)local_10c8._8_4_ * fVar42;
                local_1068[3] = (float)local_10c8._12_4_ * fVar71;
                local_1188 = auVar50;
                local_1058[0] = fVar67 * local_10b8;
                local_1058[1] = fVar58 * fStack_10b4;
                local_1058[2] = fVar42 * fStack_10b0;
                local_1058[3] = fVar71 * fStack_10ac;
                auVar79 = blendvps(_DAT_01feb9f0,auVar88,auVar50);
                auVar80._4_4_ = auVar79._0_4_;
                auVar80._0_4_ = auVar79._4_4_;
                auVar80._8_4_ = auVar79._12_4_;
                auVar80._12_4_ = auVar79._8_4_;
                auVar68 = minps(auVar80,auVar79);
                auVar60._0_8_ = auVar68._8_8_;
                auVar60._8_4_ = auVar68._0_4_;
                auVar60._12_4_ = auVar68._4_4_;
                auVar68 = minps(auVar60,auVar68);
                auVar61._0_8_ =
                     CONCAT44(-(uint)(auVar68._4_4_ == auVar79._4_4_) & auVar50._4_4_,
                              -(uint)(auVar68._0_4_ == auVar79._0_4_) & auVar50._0_4_);
                auVar61._8_4_ = -(uint)(auVar68._8_4_ == auVar79._8_4_) & auVar50._8_4_;
                auVar61._12_4_ = -(uint)(auVar68._12_4_ == auVar79._12_4_) & auVar50._12_4_;
                iVar23 = movmskps(iVar23,auVar61);
                if (iVar23 != 0) {
                  auVar50._8_4_ = auVar61._8_4_;
                  auVar50._0_8_ = auVar61._0_8_;
                  auVar50._12_4_ = auVar61._12_4_;
                }
                uVar24 = movmskps(iVar23,auVar50);
                uVar27 = CONCAT44((int)((ulong)lVar26 >> 0x20),uVar24);
                piVar33 = (int *)0x0;
                if (uVar27 != 0) {
                  for (; (uVar27 >> (long)piVar33 & 1) == 0; piVar33 = (int *)((long)piVar33 + 1)) {
                  }
                }
                do {
                  uVar41 = *(uint *)((long)&local_f88 + (long)piVar33 * 4);
                  piVar28 = (int *)(ulong)uVar41;
                  pGVar15 = (pSVar9->geometries).items[(long)piVar28].ptr;
                  if ((pGVar15->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_1188 + (long)piVar33 * 4) = 0;
                  }
                  else {
                    if ((local_1198->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar67 = local_1068[(long)piVar33];
                      fVar58 = local_1058[(long)piVar33];
                      (ray->super_RayK<1>).tfar = *(float *)(local_1048 + (long)piVar33 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_1038 + (long)piVar33 * 4);
                      (ray->Ng).field_0.field_0.y = local_1028[(long)piVar33];
                      (ray->Ng).field_0.field_0.z = local_1018[(long)piVar33];
                      ray->u = fVar67;
                      ray->v = fVar58;
                      ray->primID = *(uint *)((long)&local_10d8 + (long)piVar33 * 4);
                      ray->geomID = uVar41;
                      pRVar16 = local_1198->user;
                      ray->instID[0] = pRVar16->instID[0];
                      ray->instPrimID[0] = pRVar16->instPrimID[0];
                      break;
                    }
                    local_1170 = local_1198->args;
                    local_1138 = auVar88;
                    local_1168.context = local_1198->user;
                    local_1108 = *(float *)(local_1038 + (long)piVar33 * 4);
                    local_1104 = local_1028[(long)piVar33];
                    local_1100 = local_1018[(long)piVar33];
                    local_10fc = local_1068[(long)piVar33];
                    local_10f8 = local_1058[(long)piVar33];
                    local_10f4 = *(undefined4 *)((long)&local_10d8 + (long)piVar33 * 4);
                    local_10f0 = uVar41;
                    local_10ec = (local_1168.context)->instID[0];
                    local_10e8 = (local_1168.context)->instPrimID[0];
                    fVar67 = (ray->super_RayK<1>).tfar;
                    local_1120 = piVar33;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1048 + (long)piVar33 * 4);
                    local_119c = -1;
                    local_1168.valid = &local_119c;
                    local_1168.geometryUserPtr = pGVar15->userPtr;
                    local_1168.ray = (RTCRayN *)ray;
                    local_1168.hit = (RTCHitN *)&local_1108;
                    local_1168.N = 1;
                    local_1128 = pGVar15;
                    if ((pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar15->intersectionFilterN)(&local_1168), *local_1168.valid != 0)) {
                      if (local_1170->filter != (RTCFilterFunctionN)0x0) {
                        if (((local_1170->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((local_1128->field_8).field_0x2 & 0x40) != 0)) {
                          (*local_1170->filter)(&local_1168);
                        }
                        if (*local_1168.valid == 0) goto LAB_00e72efe;
                      }
                      (((Vec3f *)((long)local_1168.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1168.hit;
                      (((Vec3f *)((long)local_1168.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1168.hit + 4);
                      (((Vec3f *)((long)local_1168.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1168.hit + 8);
                      *(float *)((long)local_1168.ray + 0x3c) = *(float *)(local_1168.hit + 0xc);
                      *(float *)((long)local_1168.ray + 0x40) = *(float *)(local_1168.hit + 0x10);
                      *(float *)((long)local_1168.ray + 0x44) = *(float *)(local_1168.hit + 0x14);
                      *(float *)((long)local_1168.ray + 0x48) = *(float *)(local_1168.hit + 0x18);
                      *(float *)((long)local_1168.ray + 0x4c) = *(float *)(local_1168.hit + 0x1c);
                      *(float *)((long)local_1168.ray + 0x50) = *(float *)(local_1168.hit + 0x20);
                    }
                    else {
LAB_00e72efe:
                      (ray->super_RayK<1>).tfar = fVar67;
                    }
                    piVar28 = local_1120;
                    *(undefined4 *)(local_1188 + (long)local_1120 * 4) = 0;
                    fVar67 = (ray->super_RayK<1>).tfar;
                    local_1188._4_4_ = -(uint)(local_1138._4_4_ <= fVar67) & local_1188._4_4_;
                    local_1188._0_4_ = -(uint)(local_1138._0_4_ <= fVar67) & local_1188._0_4_;
                    local_1188._8_4_ = -(uint)(local_1138._8_4_ <= fVar67) & local_1188._8_4_;
                    local_1188._12_4_ = -(uint)(local_1138._12_4_ <= fVar67) & local_1188._12_4_;
                    auVar88 = local_1138;
                  }
                  iVar23 = movmskps((int)piVar28,local_1188);
                  if (iVar23 == 0) break;
                  local_1138 = auVar88;
                  BVHNIntersector1<4,1,false,embree::sse42::ArrayIntersector1<embree::sse42::TriangleMiIntersector1Moeller<4,true>>>
                  ::intersect();
                  piVar33 = local_1168.valid;
                  auVar88 = local_1138;
                } while( true );
              }
            }
            lVar39 = lVar39 + 1;
            pRVar36 = local_1198;
          } while (lVar39 != uVar32 - 8);
        }
        fVar58 = (ray->super_RayK<1>).tfar;
        uVar32 = local_1118;
        uVar27 = local_1110;
        fVar67 = local_fa8;
        fVar42 = fStack_fa4;
        fVar71 = fStack_fa0;
        fVar62 = fStack_f9c;
        fVar53 = local_fb8;
        fVar74 = fStack_fb4;
        fVar63 = fStack_fb0;
        fVar77 = fStack_fac;
        fVar64 = local_fc8;
        fVar106 = fStack_fc4;
        fVar108 = fStack_fc0;
        fVar104 = fStack_fbc;
        fVar105 = local_fd8;
        fVar107 = fStack_fd4;
        fVar109 = fStack_fd0;
        fVar78 = fStack_fcc;
        fVar81 = local_fe8;
        fVar82 = fStack_fe4;
        fVar83 = fStack_fe0;
        fVar84 = fStack_fdc;
        fVar89 = local_ff8;
        fVar90 = fStack_ff4;
        fVar91 = fStack_ff0;
        fVar94 = fStack_fec;
        fVar97 = local_1008;
        fVar98 = fStack_1004;
        fVar99 = fStack_1000;
        fVar100 = fStack_ffc;
        fVar101 = fVar58;
        fVar102 = fVar58;
        fVar103 = fVar58;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }